

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

int lex_scan(lex_t *lex,json_error_t *error)

{
  strbuffer_t *strbuff;
  anon_union_16_3_477c3ef1_for_value *paVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  ulong extraout_RAX;
  byte *buffer;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  char *pcVar8;
  json_error_code code;
  byte *pbVar9;
  byte *pbVar10;
  bool bVar11;
  char *end;
  char *local_48;
  anon_union_16_3_477c3ef1_for_value *local_40;
  char *local_38;
  
  strbuff = &lex->saved_text;
  strbuffer_clear(strbuff);
  if (lex->token == 0x100) {
    jsonp_free((lex->value).string.val);
    (lex->value).string.val = (char *)0x0;
    (lex->value).string.len = 0;
  }
  do {
    uVar3 = stream_get(&lex->stream,error);
    uVar7 = (ulong)(uVar3 + 2);
    if (0x22 < uVar3 + 2) goto LAB_00118343;
  } while ((0x400009800U >> (uVar7 & 0x3f) & 1) != 0);
  if (uVar7 == 0) {
LAB_00118626:
    lex->token = -1;
    goto LAB_0011862d;
  }
  if (uVar7 == 1) {
    lex->token = 0;
    goto LAB_0011862d;
  }
LAB_00118343:
  strbuffer_append_byte(strbuff,(char)uVar3);
  uVar7 = (ulong)(uVar3 - 0x22);
  if (uVar3 - 0x22 < 0x3c) {
    if ((0xa00000001000400U >> (uVar7 & 0x3f) & 1) == 0) {
      if (uVar7 == 0) {
        local_40 = &lex->value;
        (lex->value).string.val = (char *)0x0;
        lex->token = -1;
        uVar3 = lex_get_save(lex,error);
LAB_001183af:
        if (uVar3 != 0xfffffffe) {
          if (uVar3 != 0x22) {
            if (uVar3 == 0xffffffff) {
              pcVar8 = "premature end of input";
              code = json_error_premature_end_of_input;
              goto LAB_001187cd;
            }
            if (0x1f < uVar3) goto code_r0x001183da;
            lex_unget_unsave(lex,uVar3);
            if (uVar3 == 10) {
              pcVar8 = "unexpected newline";
              goto LAB_001187c2;
            }
            pcVar8 = "control character 0x%x";
            goto LAB_001188df;
          }
          buffer = (byte *)jsonp_malloc((lex->saved_text).length + 1);
          if (buffer != (byte *)0x0) {
            (local_40->string).val = (char *)buffer;
            pcVar8 = strbuffer_value(strbuff);
            pbVar9 = (byte *)(pcVar8 + 1);
            goto LAB_00118688;
          }
        }
        goto LAB_001188e6;
      }
      goto LAB_00118485;
    }
  }
  else {
LAB_00118485:
    if ((uVar3 != 0x7d) && (uVar3 != 0x7b)) {
      if (uVar3 != 0x2d && 9 < uVar3 - 0x30) {
        if ((uVar3 & 0xffffffdf) - 0x41 < 0x1a) {
          do {
            uVar3 = lex_get_save(lex,error);
          } while ((uVar3 & 0xffffffdf) - 0x41 < 0x1a);
          lex_unget_unsave(lex,uVar3);
          pcVar8 = strbuffer_value(strbuff);
          uVar3 = strcmp(pcVar8,"true");
          uVar7 = (ulong)uVar3;
          if (uVar3 == 0) {
            lex->token = 0x103;
            goto LAB_0011862d;
          }
          uVar3 = strcmp(pcVar8,"false");
          uVar7 = (ulong)uVar3;
          if (uVar3 == 0) {
            lex->token = 0x104;
            goto LAB_0011862d;
          }
          uVar3 = strcmp(pcVar8,"null");
          uVar7 = (ulong)uVar3;
          if (uVar3 == 0) {
            lex->token = 0x105;
            goto LAB_0011862d;
          }
        }
        else {
          lex_save_cached(lex);
          uVar7 = extraout_RAX;
        }
        goto LAB_00118626;
      }
      lex->token = -1;
      if (uVar3 == 0x2d) {
        uVar3 = lex_get_save(lex,error);
      }
      if (uVar3 == 0x30) {
        uVar3 = lex_get_save(lex,error);
        if (9 < uVar3 - 0x30) {
LAB_001185a3:
          if ((lex->flags & 8) == 0) {
            if (uVar3 == 0x2e) {
LAB_001187e9:
              iVar5 = stream_get(&lex->stream,error);
              if (9 < iVar5 - 0x30U) {
                stream_unget(&lex->stream,iVar5);
                uVar7 = extraout_RAX_03;
                goto LAB_0011862d;
              }
              strbuffer_append_byte(strbuff,(char)iVar5);
              do {
                uVar3 = lex_get_save(lex,error);
              } while (uVar3 - 0x30 < 10);
              goto LAB_00118820;
            }
            if ((uVar3 == 0x45) || (uVar3 == 0x65)) goto LAB_00118820;
            lex_unget_unsave(lex,uVar3);
            pcVar8 = strbuffer_value(strbuff);
            piVar6 = __errno_location();
            *piVar6 = 0;
            uVar7 = strtoll(pcVar8,&local_48,10);
            if (*piVar6 != 0x22) {
              if (local_48 != pcVar8 + (lex->saved_text).length) {
                __assert_fail("end == saved_text + lex->saved_text.length",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                              ,0x1ff,"int lex_scan_number(lex_t *, int, json_error_t *)");
              }
              lex->token = 0x101;
              (lex->value).integer = uVar7;
              goto LAB_0011862d;
            }
            if ((long)uVar7 < 0) {
              pcVar8 = "too big negative integer";
            }
            else {
              pcVar8 = "too big integer";
            }
          }
          else {
            if (uVar3 == 0x2e) goto LAB_001187e9;
LAB_00118820:
            if ((uVar3 & 0xffffffdf) == 0x45) {
              uVar3 = lex_get_save(lex,error);
              if ((uVar3 == 0x2d) || (uVar3 == 0x2b)) {
                uVar3 = lex_get_save(lex,error);
              }
              if (9 < uVar3 - 0x30) goto LAB_001188a7;
              do {
                uVar3 = lex_get_save(lex,error);
              } while (uVar3 - 0x30 < 10);
            }
            lex_unget_unsave(lex,uVar3);
            uVar3 = jsonp_strtod(strbuff,(double *)&local_38);
            uVar7 = (ulong)uVar3;
            if (uVar3 == 0) {
              lex->token = 0x102;
              (lex->value).string.val = local_38;
              goto LAB_0011862d;
            }
            pcVar8 = "real number overflow";
          }
          error_set(error,lex,json_error_numeric_overflow,pcVar8);
          uVar7 = extraout_RAX_00;
          goto LAB_0011862d;
        }
      }
      else if (uVar3 - 0x30 < 10) {
        do {
          uVar3 = lex_get_save(lex,error);
        } while (uVar3 - 0x30 < 10);
        goto LAB_001185a3;
      }
LAB_001188a7:
      lex_unget_unsave(lex,uVar3);
      uVar7 = extraout_RAX_01;
      goto LAB_0011862d;
    }
  }
  lex->token = uVar3;
LAB_0011862d:
  return (int)uVar7;
code_r0x001183da:
  uVar4 = lex_get_save(lex,error);
  bVar11 = uVar3 != 0x5c;
  uVar3 = uVar4;
  if (bVar11) goto LAB_001183af;
  if ((0x37 < uVar4 - 0x2f) || ((0x88200000000001U >> ((ulong)(uVar4 - 0x2f) & 0x3f) & 1) == 0)) {
    switch(uVar4) {
    case 0x6e:
    case 0x72:
    case 0x74:
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
switchD_00118409_caseD_6f:
      pcVar8 = "invalid escape";
LAB_001187c2:
      code = json_error_invalid_syntax;
LAB_001187cd:
      error_set(error,lex,code,pcVar8);
      goto LAB_001188e6;
    case 0x75:
      uVar3 = lex_get_save(lex,error);
      iVar5 = 4;
      do {
        if ((9 < uVar3 - 0x30) &&
           ((0x25 < uVar3 - 0x41 || ((0x3f0000003fU >> ((ulong)(uVar3 - 0x41) & 0x3f) & 1) == 0))))
        goto switchD_00118409_caseD_6f;
        uVar3 = lex_get_save(lex,error);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      goto LAB_001183af;
    default:
      if (uVar4 != 0x22) goto switchD_00118409_caseD_6f;
    }
  }
  uVar3 = lex_get_save(lex,error);
  goto LAB_001183af;
LAB_00118688:
  bVar2 = *pbVar9;
  uVar7 = (ulong)bVar2;
  if (bVar2 == 0x5c) {
    bVar2 = pbVar9[1];
    if (bVar2 < 0x62) {
      if (((bVar2 != 0x22) && (bVar2 != 0x2f)) && (bVar2 != 0x5c)) goto switchD_001186d5_caseD_6f;
    }
    else {
      switch(bVar2) {
      case 0x6e:
        bVar2 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_001186d5_caseD_6f:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                      ,0x1b7,"void lex_scan_string(lex_t *, json_error_t *)");
      case 0x72:
        bVar2 = 0xd;
        break;
      case 0x74:
        bVar2 = 9;
        break;
      case 0x75:
        uVar3 = decode_unicode_escape((char *)(pbVar9 + 1));
        pbVar10 = pbVar9;
        if ((int)uVar3 < 0) {
LAB_001189ac:
          error_set(error,lex,json_error_invalid_syntax,"invalid Unicode escape \'%.6s\'",pbVar10);
          goto LAB_001188e6;
        }
        pbVar10 = pbVar9 + 6;
        if ((uVar3 & 0x7ffffc00) == 0xd800) {
          if ((*pbVar10 != 0x5c) || (pbVar9[7] != 0x75)) {
LAB_0011895a:
            pcVar8 = "invalid Unicode \'\\u%04X\'";
LAB_001188df:
            error_set(error,lex,json_error_invalid_syntax,pcVar8,(ulong)uVar3);
LAB_001188e6:
            paVar1 = local_40;
            jsonp_free((local_40->string).val);
            (paVar1->string).val = (char *)0x0;
            (paVar1->string).len = 0;
            uVar7 = extraout_RAX_02;
            goto LAB_0011862d;
          }
          uVar4 = decode_unicode_escape((char *)(pbVar9 + 7));
          if ((int)uVar4 < 0) goto LAB_001189ac;
          if ((uVar4 & 0x7ffffc00) != 0xdc00) {
            error_set(error,lex,json_error_invalid_syntax,"invalid Unicode \'\\u%04X\\u%04X\'",
                      (ulong)uVar3,(ulong)uVar4);
            goto LAB_001188e6;
          }
          pbVar10 = pbVar9 + 0xc;
          uVar3 = uVar3 * 0x400 + uVar4 + 0xfca02400;
        }
        else if ((uVar3 & 0x7ffffc00) == 0xdc00) goto LAB_0011895a;
        iVar5 = utf8_encode(uVar3,(char *)buffer,(size_t *)&local_48);
        if (iVar5 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                        ,0x19e,"void lex_scan_string(lex_t *, json_error_t *)");
        }
        buffer = buffer + (long)local_48;
        pbVar9 = pbVar10;
        goto LAB_00118688;
      default:
        if (bVar2 == 0x62) {
          bVar2 = 8;
        }
        else {
          if (bVar2 != 0x66) goto switchD_001186d5_caseD_6f;
          bVar2 = 0xc;
        }
      }
    }
    *buffer = bVar2;
    buffer = buffer + 1;
    pbVar9 = pbVar9 + 2;
    goto LAB_00118688;
  }
  if (bVar2 == 0x22) goto LAB_001188b1;
  *buffer = bVar2;
  buffer = buffer + 1;
  pbVar9 = pbVar9 + 1;
  goto LAB_00118688;
LAB_001188b1:
  *buffer = 0;
  (lex->value).string.len = (long)buffer - (lex->value).integer;
  lex->token = 0x100;
  goto LAB_0011862d;
}

Assistant:

static int lex_scan(lex_t *lex, json_error_t *error) {
    int c;

    strbuffer_clear(&lex->saved_text);

    if (lex->token == TOKEN_STRING)
        lex_free_string(lex);

    do
        c = lex_get(lex, error);
    while (c == ' ' || c == '\t' || c == '\n' || c == '\r');

    if (c == STREAM_STATE_EOF) {
        lex->token = TOKEN_EOF;
        goto out;
    }

    if (c == STREAM_STATE_ERROR) {
        lex->token = TOKEN_INVALID;
        goto out;
    }

    lex_save(lex, c);

    if (c == '{' || c == '}' || c == '[' || c == ']' || c == ':' || c == ',')
        lex->token = c;

    else if (c == '"')
        lex_scan_string(lex, error);

    else if (l_isdigit(c) || c == '-') {
        if (lex_scan_number(lex, c, error))
            goto out;
    } else if (l_isalpha(c)) {
        /* eat up the whole identifier for clearer error messages */
        const char *saved_text;

        do
            c = lex_get_save(lex, error);
        while (l_isalpha(c));
        lex_unget_unsave(lex, c);

        saved_text = strbuffer_value(&lex->saved_text);

        if (strcmp(saved_text, "true") == 0)
            lex->token = TOKEN_TRUE;
        else if (strcmp(saved_text, "false") == 0)
            lex->token = TOKEN_FALSE;
        else if (strcmp(saved_text, "null") == 0)
            lex->token = TOKEN_NULL;
        else
            lex->token = TOKEN_INVALID;
    } else {
        /* save the rest of the input UTF-8 sequence to get an error
           message of valid UTF-8 */
        lex_save_cached(lex);
        lex->token = TOKEN_INVALID;
    }

    out:
    return lex->token;
}